

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

void __thiscall QAccessibleTabBar::QAccessibleTabBar(QAccessibleTabBar *this,QWidget *w)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QAccessibleWidget::QAccessibleWidget
            (&this->super_QAccessibleWidget,w,PageTabList,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  *(undefined ***)&this->super_QAccessibleWidget = &PTR__QAccessibleTabBar_007e0558;
  *(undefined ***)&(this->super_QAccessibleWidget).super_QAccessibleActionInterface =
       &PTR__QAccessibleTabBar_007e0668;
  *(undefined ***)&this->super_QAccessibleSelectionInterface = &PTR__QAccessibleTabBar_007e06b0;
  (this->m_childInterfaces).d = (Data *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleTabBar::QAccessibleTabBar(QWidget *w)
: QAccessibleWidget(w, QAccessible::PageTabList)
{
    Q_ASSERT(tabBar());
}